

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O1

void __thiscall
spvtools::EnumSet<spvtools::Extension>::InsertBucketFor
          (EnumSet<spvtools::Extension> *this,size_t index,Extension value)

{
  iterator iVar1;
  Extension EVar2;
  Bucket bucket;
  value_type local_20;
  
  local_20.data = 1L << ((byte)value & 0x3f);
  EVar2 = value & ~kSPV_INTEL_masked_gather_scatter;
  local_20.start = EVar2;
  iVar1 = std::
          vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
          ::_M_insert_rval(&this->buckets_,
                           (this->buckets_).
                           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                           ._M_impl.super__Vector_impl_data._M_start + index,&local_20);
  if ((iVar1._M_current + 1 !=
       (this->buckets_).
       super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (iVar1._M_current[1].start <= EVar2)) {
    __assert_fail("std::next(it) == buckets_.end() || std::next(it)->start > bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/enum_set.h"
                  ,0x1ac,
                  "void spvtools::EnumSet<spvtools::Extension>::InsertBucketFor(size_t, T) [T = spvtools::Extension]"
                 );
  }
  if ((iVar1._M_current !=
       (this->buckets_).
       super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_start) && (EVar2 <= iVar1._M_current[-1].start)) {
    __assert_fail("it == buckets_.begin() || std::prev(it)->start < bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/enum_set.h"
                  ,0x1ad,
                  "void spvtools::EnumSet<spvtools::Extension>::InsertBucketFor(size_t, T) [T = spvtools::Extension]"
                 );
  }
  return;
}

Assistant:

void InsertBucketFor(size_t index, T value) {
    const T bucket_start = ComputeBucketStart(value);
    Bucket bucket = {1ULL << ComputeBucketOffset(value), bucket_start};
    auto it = buckets_.emplace(buckets_.begin() + index, std::move(bucket));
#if defined(NDEBUG)
    (void)it;  // Silencing unused variable warning.
#else
    assert(std::next(it) == buckets_.end() ||
           std::next(it)->start > bucket_start);
    assert(it == buckets_.begin() || std::prev(it)->start < bucket_start);
#endif
  }